

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<ExpressionEvalContext::StackVariable,_32U>::SmallArray
          (SmallArray<ExpressionEvalContext::StackVariable,_32U> *this,Allocator *allocator)

{
  StackVariable *local_20;
  Allocator *allocator_local;
  SmallArray<ExpressionEvalContext::StackVariable,_32U> *this_local;
  
  local_20 = this->little;
  do {
    ExpressionEvalContext::StackVariable::StackVariable(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (StackVariable *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 0x20;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}